

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O0

void Gia_ManSatokoCall(Gia_Man_t *p,satoko_opts_t *opts,int fSplit,int fIncrem)

{
  int iVar1;
  uint uVar2;
  int n_vars;
  abctime aVar3;
  Cnf_Dat_t *pCnf_00;
  satoko_t *s;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  abctime aVar6;
  abctime aVar7;
  Gia_Man_t *p_01;
  bool bVar8;
  abctime clk_2;
  abctime clk_1;
  satoko_t *pSat;
  Cnf_Dat_t *pCnf;
  abctime clk;
  int status;
  int iLit;
  int i;
  Vec_Int_t *vCone;
  Gia_Obj_t *pRoot;
  Gia_Man_t *pOne;
  int fUseCone;
  int fIncrem_local;
  int fSplit_local;
  satoko_opts_t *opts_local;
  Gia_Man_t *p_local;
  
  if (fIncrem == 0) {
    if (fSplit == 0) {
      Gia_ManSatokoCallOne(p,opts,-1);
    }
    else {
      aVar3 = Abc_Clock();
      status = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCos);
        bVar8 = false;
        if (status < iVar1) {
          vCone = (Vec_Int_t *)Gia_ManCo(p,status);
          bVar8 = vCone != (Vec_Int_t *)0x0;
        }
        if (!bVar8) break;
        p_01 = Gia_ManDupDfsCone(p,(Gia_Obj_t *)vCone);
        Gia_ManSatokoCallOne(p_01,opts,status);
        Gia_ManStop(p_01);
        status = status + 1;
      }
      aVar7 = Abc_Clock();
      Abc_PrintTime(1,"Total time",aVar7 - aVar3);
    }
  }
  else {
    aVar3 = Abc_Clock();
    pCnf_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,1,0);
    s = Gia_ManSatokoInit(pCnf_00,opts);
    status = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar8 = false;
      if (status < iVar1) {
        pGVar4 = Gia_ManCo(p,status);
        bVar8 = pGVar4 != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      aVar7 = Abc_Clock();
      iVar1 = Abc_Var2Lit(status + 1,0);
      satoko_assump_push(s,iVar1);
      p_00 = Gia_ManCollectVars(status + 1,pCnf_00->vMapping,pCnf_00->nVars);
      piVar5 = Vec_IntArray(p_00);
      iVar1 = Vec_IntSize(p_00);
      satoko_mark_cone(s,piVar5,iVar1);
      uVar2 = Vec_IntSize(p_00);
      printf("Cone has %6d vars (out of %6d).  ",(ulong)uVar2,(ulong)(uint)pCnf_00->nVars);
      iVar1 = satoko_solve(s);
      piVar5 = Vec_IntArray(p_00);
      n_vars = Vec_IntSize(p_00);
      satoko_unmark_cone(s,piVar5,n_vars);
      Vec_IntFree(p_00);
      satoko_assump_pop(s);
      aVar6 = Abc_Clock();
      Gia_ManSatokoReport(status,iVar1,aVar6 - aVar7);
      status = status + 1;
    }
    Cnf_DataFree(pCnf_00);
    satoko_destroy(s);
    aVar7 = Abc_Clock();
    Abc_PrintTime(1,"Total time",aVar7 - aVar3);
  }
  return;
}

Assistant:

void Gia_ManSatokoCall( Gia_Man_t * p, satoko_opts_t * opts, int fSplit, int fIncrem )
{
    int fUseCone = 1;
    Gia_Man_t * pOne;
    Gia_Obj_t * pRoot;
    Vec_Int_t * vCone;
    int i, iLit, status;
    if ( fIncrem )
    {
        abctime clk = Abc_Clock();
        Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, fUseCone, 0 );
        satoko_t * pSat = Gia_ManSatokoInit( pCnf, opts );
        Gia_ManForEachCo( p, pRoot, i )
        {
            abctime clk = Abc_Clock();
            iLit = Abc_Var2Lit( i+1, 0 );
            satoko_assump_push( pSat, iLit );
            if ( fUseCone )
            {
                vCone = Gia_ManCollectVars( i+1, pCnf->vMapping, pCnf->nVars );
                satoko_mark_cone( pSat, Vec_IntArray(vCone), Vec_IntSize(vCone) );
                printf( "Cone has %6d vars (out of %6d).  ", Vec_IntSize(vCone), pCnf->nVars );
                status = satoko_solve( pSat );
                satoko_unmark_cone( pSat, Vec_IntArray(vCone), Vec_IntSize(vCone) );
                Vec_IntFree( vCone );
            }
            else
            {
                status = satoko_solve( pSat );
            }
            satoko_assump_pop( pSat );
            Gia_ManSatokoReport( i, status, Abc_Clock() - clk );
        }
        Cnf_DataFree( pCnf );
        satoko_destroy( pSat );
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
        return;
    }
    if ( fSplit )
    {
        abctime clk = Abc_Clock();
        Gia_ManForEachCo( p, pRoot, i )
        {
            pOne = Gia_ManDupDfsCone( p, pRoot );
            Gia_ManSatokoCallOne( pOne, opts, i );
            Gia_ManStop( pOne );
        }
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
        return;
    }
    Gia_ManSatokoCallOne( p, opts, -1 );
}